

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

Pool * __thiscall State::LookupPool(State *this,string *pool_name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator i;
  string *pool_name_local;
  State *this_local;
  
  i._M_node = (_Base_ptr)pool_name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
       ::find(&this->pools_,pool_name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
       ::end(&this->pools_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (State *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
             ::operator->(&local_28);
    this_local = (State *)ppVar2->second;
  }
  return (Pool *)this_local;
}

Assistant:

Pool* State::LookupPool(const string& pool_name) {
  map<string, Pool*>::iterator i = pools_.find(pool_name);
  if (i == pools_.end())
    return NULL;
  return i->second;
}